

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.cpp
# Opt level: O1

int __thiscall Program::getNextLineNumber(Program *this,int lineNumber)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  undefined1 *puVar3;
  Program *pPVar4;
  _Base_ptr p_Var5;
  
  p_Var1 = &(this->list_of_program)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = (this->list_of_program)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var2 = &p_Var1->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < lineNumber]
      ) {
    if (lineNumber <= (int)p_Var5[1]._M_color) {
      p_Var2 = p_Var5;
    }
  }
  p_Var5 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var2 != p_Var1) &&
     (p_Var5 = p_Var2, lineNumber < (int)p_Var2[1]._M_color)) {
    p_Var5 = &p_Var1->_M_header;
  }
  puVar3 = (undefined1 *)std::_Rb_tree_increment(p_Var5);
  pPVar4 = (Program *)(puVar3 + 0x20);
  if ((_Rb_tree_header *)puVar3 == p_Var1) {
    pPVar4 = this;
  }
  return pPVar4->end_line;
}

Assistant:

int Program::getNextLineNumber(int lineNumber) {
    auto iter = list_of_program.find(lineNumber);
    iter++;
    if (iter == list_of_program.end()) return end_line;
    return iter->first;
}